

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS
ref_geom_bspline_fit(REF_INT degree,REF_INT n_control_point,REF_DBL *t,REF_DBL *uv,REF_DBL *bundle)

{
  uint uVar1;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  REF_DBL *ab;
  REF_DBL *N;
  REF_DBL *pRVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  ulong uVar11;
  REF_DBL *pRVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  REF_DBL *pRVar16;
  double dVar17;
  
  uVar3 = n_control_point * 2;
  for (lVar4 = 0; lVar4 <= n_control_point + degree; lVar4 = lVar4 + 1) {
    bundle[lVar4] = -1.0;
  }
  lVar4 = (long)degree;
  for (lVar8 = 0; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
    bundle[lVar8] = *t;
  }
  iVar10 = (n_control_point + -1) - degree;
  iVar7 = 0;
  if (0 < iVar10) {
    iVar7 = iVar10;
  }
  for (uVar11 = 1; uVar11 != iVar7 + 1; uVar11 = uVar11 + 1) {
    lVar8 = uVar11 + lVar4;
    bundle[lVar8] = 0.0;
    dVar17 = 0.0;
    for (uVar13 = uVar11; (long)uVar13 < lVar8; uVar13 = uVar13 + 1) {
      dVar17 = dVar17 + t[uVar13] / (double)degree;
      bundle[lVar8] = dVar17;
    }
  }
  for (lVar8 = 0; lVar8 <= lVar4; lVar8 = lVar8 + 1) {
    bundle[n_control_point + lVar8] = t[n_control_point + -1];
  }
  uVar1 = (uVar3 | 1) * uVar3;
  if ((int)uVar1 < 0) {
    pcVar15 = "malloc ab of REF_DBL negative";
    uVar9 = 0x111f;
LAB_00144d21:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
           "ref_geom_bspline_fit",pcVar15);
    RVar2 = 1;
  }
  else {
    ab = (REF_DBL *)malloc((ulong)uVar1 * 8);
    if (ab == (REF_DBL *)0x0) {
      pcVar15 = "malloc ab of REF_DBL NULL";
      uVar9 = 0x111f;
    }
    else {
      for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
        ab[uVar11] = 0.0;
      }
      if (n_control_point < 0) {
        pcVar15 = "malloc N of REF_DBL negative";
        uVar9 = 0x1120;
        goto LAB_00144d21;
      }
      uVar11 = (ulong)(uint)n_control_point;
      N = (REF_DBL *)malloc(uVar11 * 8);
      if (N != (REF_DBL *)0x0) {
        uVar1 = uVar3 * uVar3;
        uVar13 = (ulong)uVar3;
        pRVar12 = (REF_DBL *)((uVar13 * 8 + 8) * uVar11 + (long)ab);
        uVar14 = 0;
        pRVar16 = ab;
        do {
          if (uVar14 == uVar11) {
            uVar3 = ref_matrix_solve_ab(uVar3,uVar3 | 1,ab);
            if (uVar3 == 0) {
              for (lVar4 = 0; uVar11 * 2 != lVar4; lVar4 = lVar4 + 2) {
                bundle[(long)(n_control_point + degree) + lVar4 + 1] =
                     *(REF_DBL *)((long)ab + lVar4 * 4 + (ulong)uVar1 * 8);
                bundle[n_control_point + degree + 2 + (int)lVar4] =
                     *(REF_DBL *)((long)ab + lVar4 * 4 + (ulong)(uVar1 + n_control_point) * 8);
              }
              free(N);
              free(ab);
              return 0;
            }
            pcVar15 = "solve";
            uVar9 = 0x1135;
LAB_00144dce:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar9,"ref_geom_bspline_fit",(ulong)uVar3,pcVar15);
            return uVar3;
          }
          RVar2 = ref_geom_bspline_row(degree,n_control_point,bundle,t[uVar14],N);
          if (RVar2 != 0) {
            pcVar15 = "row";
            uVar3 = 1;
            uVar9 = 0x1122;
            goto LAB_00144dce;
          }
          pRVar5 = pRVar16;
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            *pRVar5 = N[uVar6];
            pRVar5 = pRVar5 + uVar13;
          }
          ab[uVar1 + uVar14] = uv[uVar14 * 2];
          pRVar5 = pRVar12;
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            *pRVar5 = N[uVar6];
            pRVar5 = pRVar5 + uVar13;
          }
          ab[(uVar1 + n_control_point) + uVar14] = uv[uVar14 * 2 + 1];
          uVar14 = uVar14 + 1;
          pRVar16 = pRVar16 + 1;
          pRVar12 = pRVar12 + 1;
        } while( true );
      }
      pcVar15 = "malloc N of REF_DBL NULL";
      uVar9 = 0x1120;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar9,
           "ref_geom_bspline_fit",pcVar15);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_fit(REF_INT degree, REF_INT n_control_point,
                                        REF_DBL *t, REF_DBL *uv,
                                        REF_DBL *bundle) {
  REF_INT rows = 2 * n_control_point;
  REF_INT cols = 2 * n_control_point + 1;
  REF_DBL *ab;
  REF_DBL *N;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  REF_INT i, j;
  REF_INT row, col;

  for (i = 0; i < nknot; i++) {
    bundle[i] = -1.0;
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i] = t[0];
  }
  for (j = 1; j <= ref_geom_bspline_n(degree, n_control_point) - degree; j++) {
    bundle[j + degree] = 0.0;
    for (i = j; i <= j + degree - 1; i++)
      bundle[j + degree] += t[i] / ((REF_DBL)degree);
  }
  for (i = 0; i < degree + 1; i++) {
    bundle[i + n_control_point] = t[n_control_point - 1];
  }
  ref_malloc_init(ab, rows * cols, REF_DBL, 0.0);
  ref_malloc(N, n_control_point, REF_DBL);
  for (i = 0; i < n_control_point; i++) {
    RSS(ref_geom_bspline_row(degree, n_control_point, bundle, t[i], N), "row");
    for (j = 0; j < n_control_point; j++) {
      row = i;
      col = j;
      ab[row + col * rows] = N[j];
    }
    row = i;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[0 + 2 * i];
    for (j = 0; j < n_control_point; j++) {
      row = i + n_control_point;
      col = j + n_control_point;
      ab[row + col * rows] = N[j];
    }
    row = i + n_control_point;
    col = 2 * n_control_point;
    ab[row + col * rows] = uv[1 + 2 * i];
  }

  RSS(ref_matrix_solve_ab(rows, cols, ab), "solve");
  for (i = 0; i < n_control_point; i++) {
    row = i;
    col = 2 * n_control_point;
    bundle[0 + 2 * i + nknot] = ab[row + col * rows];
    row = i + n_control_point;
    col = 2 * n_control_point;
    bundle[1 + 2 * i + nknot] = ab[row + col * rows];
  }
  ref_free(N);
  ref_free(ab);
  return REF_SUCCESS;
}